

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlChar * xmlCatalogListXMLResolveURI(xmlCatalogEntryPtr catal,xmlChar *URI)

{
  int iVar1;
  xmlChar *pubID;
  xmlChar *urnID;
  xmlChar *ret;
  xmlChar *URI_local;
  xmlCatalogEntryPtr catal_local;
  
  urnID = (xmlChar *)0x0;
  if (catal == (xmlCatalogEntryPtr)0x0) {
    catal_local = (xmlCatalogEntryPtr)0x0;
  }
  else if (URI == (xmlChar *)0x0) {
    catal_local = (xmlCatalogEntryPtr)0x0;
  }
  else {
    iVar1 = xmlStrncmp(URI,(xmlChar *)"urn:publicid:",0xd);
    URI_local = (xmlChar *)catal;
    if (iVar1 == 0) {
      pubID = xmlCatalogUnWrapURN(URI);
      if (xmlDebugCatalogs != 0) {
        if (pubID == (xmlChar *)0x0) {
          xmlCatalogPrintDebug("URN ID %s expanded to NULL\n",URI);
        }
        else {
          xmlCatalogPrintDebug("URN ID expanded to %s\n",pubID);
        }
      }
      catal_local = (xmlCatalogEntryPtr)xmlCatalogListXMLResolve(catal,pubID,(xmlChar *)0x0);
      if (pubID != (xmlChar *)0x0) {
        (*xmlFree)(pubID);
      }
    }
    else {
      for (; URI_local != (xmlChar *)0x0; URI_local = *(xmlChar **)URI_local) {
        if (*(int *)(URI_local + 0x18) == 1) {
          if (*(long *)(URI_local + 0x10) == 0) {
            xmlFetchXMLCatalogFile((xmlCatalogEntryPtr)URI_local);
          }
          if ((*(long *)(URI_local + 0x10) != 0) &&
             (urnID = xmlCatalogXMLResolveURI(*(xmlCatalogEntryPtr *)(URI_local + 0x10),URI),
             urnID != (xmlChar *)0x0)) {
            return urnID;
          }
        }
      }
      catal_local = (xmlCatalogEntryPtr)urnID;
    }
  }
  return (xmlChar *)catal_local;
}

Assistant:

static xmlChar *
xmlCatalogListXMLResolveURI(xmlCatalogEntryPtr catal, const xmlChar *URI) {
    xmlChar *ret = NULL;
    xmlChar *urnID = NULL;

    if (catal == NULL)
        return(NULL);
    if (URI == NULL)
	return(NULL);

    if (!xmlStrncmp(URI, BAD_CAST XML_URN_PUBID, sizeof(XML_URN_PUBID) - 1)) {
	urnID = xmlCatalogUnWrapURN(URI);
	if (xmlDebugCatalogs) {
	    if (urnID == NULL)
		xmlCatalogPrintDebug(
			"URN ID %s expanded to NULL\n", URI);
	    else
		xmlCatalogPrintDebug(
			"URN ID expanded to %s\n", urnID);
	}
	ret = xmlCatalogListXMLResolve(catal, urnID, NULL);
	if (urnID != NULL)
	    xmlFree(urnID);
	return(ret);
    }
    while (catal != NULL) {
	if (catal->type == XML_CATA_CATALOG) {
	    if (catal->children == NULL) {
		xmlFetchXMLCatalogFile(catal);
	    }
	    if (catal->children != NULL) {
		ret = xmlCatalogXMLResolveURI(catal->children, URI);
		if (ret != NULL)
		    return(ret);
	    }
	}
	catal = catal->next;
    }
    return(ret);
}